

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repair.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_4::Repairer::ArchiveFile(Repairer *this,string *fname)

{
  char *__s;
  Logger *info_log;
  pointer pcVar1;
  char *pcVar2;
  Status s;
  string new_dir;
  string new_file;
  Status local_a0;
  undefined1 *local_98;
  long local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  long *local_78 [2];
  long local_68 [2];
  void *local_58;
  string local_50;
  
  __s = (fname->_M_dataplus)._M_p;
  pcVar2 = strrchr(__s,0x2f);
  local_90 = 0;
  local_88 = 0;
  local_98 = &local_88;
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)0x0,(ulong)__s);
  }
  std::__cxx11::string::append((char *)&local_98);
  (*this->env_->_vptr_Env[9])(&local_58,this->env_,&local_98);
  if (local_58 != (void *)0x0) {
    operator_delete__(local_58);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char*>((string *)local_78,local_98,local_98 + local_90);
  std::__cxx11::string::append((char *)local_78);
  std::__cxx11::string::append((char *)local_78);
  (*this->env_->_vptr_Env[0xc])(&local_a0,this->env_,fname,(string *)local_78);
  info_log = (this->options_).info_log;
  pcVar1 = (fname->_M_dataplus)._M_p;
  Status::ToString_abi_cxx11_(&local_50,&local_a0);
  Log(info_log,"Archiving %s: %s\n",pcVar1,local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_a0.state_ != (char *)0x0) {
    operator_delete__(local_a0.state_);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  return;
}

Assistant:

void ArchiveFile(const std::string& fname) {
    // Move into another directory.  E.g., for
    //    dir/foo
    // rename to
    //    dir/lost/foo
    const char* slash = strrchr(fname.c_str(), '/');
    std::string new_dir;
    if (slash != nullptr) {
      new_dir.assign(fname.data(), slash - fname.data());
    }
    new_dir.append("/lost");
    env_->CreateDir(new_dir);  // Ignore error
    std::string new_file = new_dir;
    new_file.append("/");
    new_file.append((slash == nullptr) ? fname.c_str() : slash + 1);
    Status s = env_->RenameFile(fname, new_file);
    Log(options_.info_log, "Archiving %s: %s\n", fname.c_str(),
        s.ToString().c_str());
  }